

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_secp256k1_is_zero_array_test(void)

{
  int iVar1;
  uchar buf2 [3];
  uchar buf1 [3];
  size_t in_stack_00000008;
  uchar *in_stack_00000010;
  
  iVar1 = secp256k1_is_zero_array(in_stack_00000010,in_stack_00000008);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d32,"test condition failed: secp256k1_is_zero_array(buf1, 0) == 1");
    abort();
  }
  iVar1 = secp256k1_is_zero_array(in_stack_00000010,in_stack_00000008);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d33,"test condition failed: secp256k1_is_zero_array(buf1, 1) == 1");
    abort();
  }
  iVar1 = secp256k1_is_zero_array(in_stack_00000010,in_stack_00000008);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d34,"test condition failed: secp256k1_is_zero_array(buf1, 2) == 0");
    abort();
  }
  iVar1 = secp256k1_is_zero_array(in_stack_00000010,in_stack_00000008);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d35,"test condition failed: secp256k1_is_zero_array(buf2, 1) == 0");
    abort();
  }
  iVar1 = secp256k1_is_zero_array(in_stack_00000010,in_stack_00000008);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/tests.c"
            ,0x1d36,"test condition failed: secp256k1_is_zero_array(buf2, 2) == 0");
    abort();
  }
  return;
}

Assistant:

static void run_secp256k1_is_zero_array_test(void) {
    unsigned char buf1[3] = {0, 1};
    unsigned char buf2[3] = {1, 0};

    CHECK(secp256k1_is_zero_array(buf1, 0) == 1);
    CHECK(secp256k1_is_zero_array(buf1, 1) == 1);
    CHECK(secp256k1_is_zero_array(buf1, 2) == 0);
    CHECK(secp256k1_is_zero_array(buf2, 1) == 0);
    CHECK(secp256k1_is_zero_array(buf2, 2) == 0);
}